

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-ni.c
# Opt level: O1

void aes128_ni_sdctr(ssh_cipher *ciph,void *vblk,int blklen)

{
  undefined1 auVar1 [16];
  undefined1 (*pauVar2) [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar3 [16];
  ssh_cipheralg *psVar4;
  undefined1 auVar5 [16];
  
  auVar1 = _DAT_001847e0;
  if (0 < blklen) {
    pauVar2 = (undefined1 (*) [16])((long)blklen + (long)vblk);
    auVar3 = pmovsxbq(in_XMM1,1);
    do {
      auVar5 = pshufb(*(undefined1 (*) [16])(ciph + -3),auVar1);
      auVar5 = aesenc(auVar5 ^ *(undefined1 (*) [16])(ciph + -0x3f),
                      *(undefined1 (*) [16])(ciph + -0x3d));
      auVar5 = aesenc(auVar5,*(undefined1 (*) [16])(ciph + -0x3b));
      auVar5 = aesenc(auVar5,*(undefined1 (*) [16])(ciph + -0x39));
      auVar5 = aesenc(auVar5,*(undefined1 (*) [16])(ciph + -0x37));
      auVar5 = aesenc(auVar5,*(undefined1 (*) [16])(ciph + -0x35));
      auVar5 = aesenc(auVar5,*(undefined1 (*) [16])(ciph + -0x33));
      auVar5 = aesenc(auVar5,*(undefined1 (*) [16])(ciph + -0x31));
      auVar5 = aesenc(auVar5,*(undefined1 (*) [16])(ciph + -0x2f));
      auVar5 = aesenc(auVar5,*(undefined1 (*) [16])(ciph + -0x2d));
      auVar5 = aesenclast(auVar5,*(undefined1 (*) [16])(ciph + -0x2b));
      *(undefined1 (*) [16])vblk = *vblk ^ auVar5;
      psVar4 = (ssh_cipheralg *)((long)&(ciph[-3].vt)->new + auVar3._0_8_);
      ciph[-3].vt = psVar4;
      ciph[-2].vt = (ssh_cipheralg *)
                    ((long)ciph[-2].vt +
                    (auVar3._8_8_ - ((long)-(ulong)(psVar4 == (ssh_cipheralg *)0x0) >> 0x3f)));
      vblk = (void *)((long)vblk + 0x10);
    } while (vblk < pauVar2);
  }
  return;
}

Assistant:

static inline void aes_sdctr_ni(
    ssh_cipher *ciph, void *vblk, int blklen, aes_ni_fn encrypt)
{
    aes_ni_context *ctx = container_of(ciph, aes_ni_context, ciph);

    for (uint8_t *blk = (uint8_t *)vblk, *finish = blk + blklen;
         blk < finish; blk += 16) {
        __m128i counter = aes_ni_sdctr_reverse(ctx->iv);
        __m128i keystream = encrypt(counter, ctx->keysched_e);
        __m128i input = _mm_loadu_si128((const __m128i *)blk);
        __m128i output = _mm_xor_si128(input, keystream);
        _mm_storeu_si128((__m128i *)blk, output);
        ctx->iv = aes_ni_sdctr_increment(ctx->iv);
    }
}